

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

int add_linux_if(pcap_if_t **devlistp,char *ifname,int fd,char *errbuf)

{
  ushort *puVar1;
  int iVar2;
  bpf_u_int32 flags;
  ushort **ppuVar3;
  byte *pbVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  byte *pbVar10;
  ifreq ifrflags;
  char name [512];
  char local_250 [15];
  undefined1 local_241;
  short local_240;
  byte local_228 [512];
  
  bVar8 = *ifname;
  if ((char)bVar8 < '\x01') {
    pbVar4 = local_228;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    pbVar10 = (byte *)(ifname + 1);
    pbVar4 = local_228;
    do {
      if ((*(byte *)((long)puVar1 + (ulong)bVar8 * 2 + 1) & 0x20) != 0) break;
      if (bVar8 == 0x3a) {
        bVar8 = 0x3a;
        lVar7 = 0;
        goto LAB_0011b762;
      }
      *pbVar4 = bVar8;
      pbVar4 = pbVar4 + 1;
      bVar8 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    } while ('\0' < (char)bVar8);
  }
  goto LAB_0011b788;
  while( true ) {
    pbVar4[lVar7] = bVar8;
    bVar8 = pbVar10[lVar7];
    lVar7 = lVar7 + 1;
    if ((char)bVar8 < '\0') break;
LAB_0011b762:
    if ((*(byte *)((long)puVar1 + (ulong)bVar8 * 2 + 1) & 8) == 0) break;
  }
  if (bVar8 == 0x3a) {
    pbVar4 = pbVar4 + lVar7;
  }
LAB_0011b788:
  iVar9 = 0;
  *pbVar4 = 0;
  strncpy(local_250,(char *)local_228,0x10);
  local_241 = 0;
  iVar2 = ioctl(fd,0x8913,local_250);
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    if ((iVar2 != 6) && (iVar2 != 0x13)) {
      pcVar6 = pcap_strerror(iVar2);
      snprintf(errbuf,0x100,"SIOCGIFFLAGS: %.*s: %s",0x10,local_250,pcVar6);
      iVar9 = -1;
    }
  }
  else {
    flags = if_flags_to_pcap_flags((char *)local_228,(int)local_240);
    iVar2 = pcap_add_if(devlistp,(char *)local_228,flags,(char *)0x0,errbuf);
    iVar9 = -(uint)(iVar2 == -1);
  }
  return iVar9;
}

Assistant:

static int
add_linux_if(pcap_if_t **devlistp, const char *ifname, int fd, char *errbuf)
{
	const char *p;
	char name[512];	/* XXX - pick a size */
	char *q, *saveq;
	struct ifreq ifrflags;

	/*
	 * Get the interface name.
	 */
	p = ifname;
	q = &name[0];
	while (*p != '\0' && isascii(*p) && !isspace(*p)) {
		if (*p == ':') {
			/*
			 * This could be the separator between a
			 * name and an alias number, or it could be
			 * the separator between a name with no
			 * alias number and the next field.
			 *
			 * If there's a colon after digits, it
			 * separates the name and the alias number,
			 * otherwise it separates the name and the
			 * next field.
			 */
			saveq = q;
			while (isascii(*p) && isdigit(*p))
				*q++ = *p++;
			if (*p != ':') {
				/*
				 * That was the next field,
				 * not the alias number.
				 */
				q = saveq;
			}
			break;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	/*
	 * Get the flags for this interface.
	 */
	strlcpy(ifrflags.ifr_name, name, sizeof(ifrflags.ifr_name));
	if (ioctl(fd, SIOCGIFFLAGS, (char *)&ifrflags) < 0) {
		if (errno == ENXIO || errno == ENODEV)
			return (0);	/* device doesn't actually exist - ignore it */
		(void)pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE,
		    "SIOCGIFFLAGS: %.*s: %s",
		    (int)sizeof(ifrflags.ifr_name),
		    ifrflags.ifr_name,
		    pcap_strerror(errno));
		return (-1);
	}

	/*
	 * Add an entry for this interface, with no addresses.
	 */
	if (pcap_add_if(devlistp, name,
	    if_flags_to_pcap_flags(name, ifrflags.ifr_flags), NULL,
	    errbuf) == -1) {
		/*
		 * Failure.
		 */
		return (-1);
	}

	return (0);
}